

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>::to_string<std::allocator<char>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,basic_string_view<char,std::char_traits<char>> *this,allocator<char> *__a)

{
  const_iterator __beg;
  const_iterator __end;
  allocator<char> *__a_local;
  basic_string_view<char,_std::char_traits<char>_> *this_local;
  
  __beg = basic_string_view<char,_std::char_traits<char>_>::begin
                    ((basic_string_view<char,_std::char_traits<char>_> *)this);
  __end = basic_string_view<char,_std::char_traits<char>_>::end
                    ((basic_string_view<char,_std::char_traits<char>_> *)this);
  std::__cxx11::string::string<char_const*,void>((string *)__return_storage_ptr__,__beg,__end,__a);
  return __return_storage_ptr__;
}

Assistant:

size_type copy(_CharT* __s, size_type __n, size_type __pos = 0) const
        {
            if ( __pos > size())
                __LIBCPP_STRVIEWCLONE_throw(std::out_of_range("string_view::copy"));
            size_type __rlen = std::min( __n, size() - __pos );
            std::copy_n(begin() + __pos, __rlen, __s );
            return __rlen;
        }